

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O2

UndefValue * __thiscall
LLVMBC::LLVMContext::construct<LLVMBC::UndefValue,LLVMBC::Type*&>(LLVMContext *this,Type **u)

{
  UndefValue *pUVar1;
  
  pUVar1 = (UndefValue *)allocate(this,0x38,8);
  if (pUVar1 != (UndefValue *)0x0) {
    (pUVar1->super_Constant).super_Value.type = *u;
    (pUVar1->super_Constant).super_Value.kind = Undef;
    (pUVar1->super_Constant).super_Value.tween_id = 0;
    (pUVar1->super_Constant).apint.type = (Type *)0x0;
    (pUVar1->super_Constant).apint.value = 0;
    (pUVar1->super_Constant).apfloat.type = (Type *)0x0;
    (pUVar1->super_Constant).apfloat.value = 0;
    return pUVar1;
  }
  std::terminate();
}

Assistant:

T *construct(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);

		if (!std::is_trivially_destructible<T>::value)
			append_typed_destructor(t);
		return t;
	}